

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void RulePrint(FILE *fp,rule *rp,int iCursor)

{
  symbol *psVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  fprintf((FILE *)fp,"%s ::=",rp->lhs->name);
  uVar3 = 0;
  while( true ) {
    uVar2 = rp->nrhs;
    if ((long)(int)uVar2 < (long)uVar3) {
      return;
    }
    if (uVar3 == (uint)iCursor) {
      fwrite(" *",2,1,(FILE *)fp);
      uVar2 = rp->nrhs;
    }
    if (uVar3 == uVar2) break;
    psVar1 = rp->rhs[uVar3];
    if (psVar1->type == MULTITERMINAL) {
      fprintf((FILE *)fp," %s",(*psVar1->subsym)->name);
      for (lVar4 = 1; lVar4 < psVar1->nsubsym; lVar4 = lVar4 + 1) {
        fprintf((FILE *)fp,"|%s",psVar1->subsym[lVar4]->name);
      }
    }
    else {
      fprintf((FILE *)fp," %s",psVar1->name);
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void RulePrint(FILE *fp, struct rule *rp, int iCursor){
  struct symbol *sp;
  int i, j;
  fprintf(fp,"%s ::=",rp->lhs->name);
  for(i=0; i<=rp->nrhs; i++){
    if( i==iCursor ) fprintf(fp," *");
    if( i==rp->nrhs ) break;
    sp = rp->rhs[i];
    if( sp->type==MULTITERMINAL ){
      fprintf(fp," %s", sp->subsym[0]->name);
      for(j=1; j<sp->nsubsym; j++){
        fprintf(fp,"|%s",sp->subsym[j]->name);
      }
    }else{
      fprintf(fp," %s", sp->name);
    }
  }
}